

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Mine.cpp
# Opt level: O3

void __thiscall KDIS::DATA_TYPE::Mine::AddScalarDetectionCoefficientValue(Mine *this,KUINT8 SDC)

{
  pointer *ppuVar1;
  iterator __position;
  uchar local_11;
  
  MinefieldDataFilter::SetScalarDetectionCoefficient(&this->super_MinefieldDataFilter,true);
  __position._M_current =
       (this->m_vui8SDC).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
       super__Vector_impl_data._M_finish;
  if (__position._M_current ==
      (this->m_vui8SDC).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage) {
    std::vector<unsigned_char,std::allocator<unsigned_char>>::
    _M_realloc_insert<unsigned_char_const&>
              ((vector<unsigned_char,std::allocator<unsigned_char>> *)&this->m_vui8SDC,__position,
               &local_11);
  }
  else {
    *__position._M_current = SDC;
    ppuVar1 = &(this->m_vui8SDC).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
               _M_impl.super__Vector_impl_data._M_finish;
    *ppuVar1 = *ppuVar1 + 1;
  }
  return;
}

Assistant:

void Mine::AddScalarDetectionCoefficientValue( KUINT8 SDC )
{
    SetScalarDetectionCoefficient( true );
    m_vui8SDC.push_back( SDC );
}